

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

void __thiscall
httplib::Server::write_response
          (Server *this,Stream *strm,bool last_connection,Request *req,Response *res)

{
  size_type *psVar1;
  Headers *this_00;
  ulong __val;
  bool bVar2;
  Request *pRVar3;
  Response *pRVar4;
  Stream *this_01;
  char cVar5;
  int iVar6;
  const_iterator cVar7;
  _Base_ptr p_Var8;
  ulong uVar9;
  char cVar10;
  char *pcVar11;
  _Rb_tree_header *p_Var12;
  bool bVar13;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  size_type *local_80;
  Server *local_78;
  Request *local_70;
  Response *local_68;
  Stream *local_60;
  undefined1 local_58 [8];
  string length;
  
  local_60 = strm;
  if (res->status == -1) {
    __assert_fail("res.status != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/imShayan[P]JamSpell/contrib/httplib/httplib.h"
                  ,0x5fa,
                  "void httplib::Server::write_response(Stream &, bool, const Request &, Response &)"
                 );
  }
  if ((399 < res->status) &&
     ((this->error_handler_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    (*(this->error_handler_)._M_invoker)((_Any_data *)&this->error_handler_,req,res);
  }
  iVar6 = res->status;
  if (iVar6 < 0x194) {
    if (iVar6 == 200) {
      local_58 = (undefined1  [8])0x15be01;
    }
    else if (iVar6 == 400) {
      local_58 = (undefined1  [8])0x15be04;
    }
    else {
LAB_0013db76:
      local_58 = (undefined1  [8])0x15be31;
    }
  }
  else if (iVar6 == 0x194) {
    local_58 = (undefined1  [8])0x15be10;
  }
  else {
    if (iVar6 != 0x19f) goto LAB_0013db76;
    local_58 = (undefined1  [8])0x15be1a;
  }
  local_78 = this;
  Stream::write_format<int,char_const*>
            (local_60,"HTTP/1.1 %d %s\r\n",&res->status,(char **)local_58);
  bVar13 = true;
  if (!last_connection) {
    iVar6 = std::__cxx11::string::compare((char *)req);
    if (iVar6 != 0) {
      local_58 = (undefined1  [8])&length._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Connection","");
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&(req->headers)._M_t,(key_type *)local_58);
      if (local_58 != (undefined1  [8])&length._M_string_length) {
        operator_delete((void *)local_58);
      }
      if ((_Rb_tree_header *)cVar7._M_node == &(req->headers)._M_t._M_impl.super__Rb_tree_header) {
        pcVar11 = "";
      }
      else {
        pcVar11 = *(char **)(cVar7._M_node + 2);
      }
      std::__cxx11::string::string((string *)local_a0,pcVar11,(allocator *)local_58);
      iVar6 = std::__cxx11::string::compare((char *)local_a0);
      bVar13 = iVar6 == 0;
      bVar2 = true;
      goto LAB_0013dc4e;
    }
  }
  bVar2 = false;
LAB_0013dc4e:
  if ((bVar2) && (local_a0[0] != local_90)) {
    operator_delete(local_a0[0]);
  }
  if (bVar13) {
    local_58 = (undefined1  [8])0x15bbbd;
    length.field_2._8_8_ = anon_var_dwarf_3b722;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const*&,char_const*&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&res->headers,(char **)local_58,(char **)((long)&length.field_2 + 8));
  }
  local_70 = req;
  if ((res->body)._M_string_length != 0) {
    this_00 = &res->headers;
    psVar1 = &length._M_string_length;
    local_58 = (undefined1  [8])psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Content-Type","");
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,(key_type *)local_58);
    if (local_58 != (undefined1  [8])psVar1) {
      operator_delete((void *)local_58);
    }
    if ((_Rb_tree_header *)cVar7._M_node == &(res->headers)._M_t._M_impl.super__Rb_tree_header) {
      local_58 = (undefined1  [8])0x15bbe3;
      length.field_2._8_8_ = anon_var_dwarf_44115;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<char_const*&,char_const*&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)this_00,(char **)local_58,(char **)((long)&length.field_2 + 8));
    }
    __val = (res->body)._M_string_length;
    cVar10 = '\x01';
    if (9 < __val) {
      uVar9 = __val;
      cVar5 = '\x04';
      do {
        cVar10 = cVar5;
        if (uVar9 < 100) {
          cVar10 = cVar10 + -2;
          goto LAB_0013dd6d;
        }
        if (uVar9 < 1000) {
          cVar10 = cVar10 + -1;
          goto LAB_0013dd6d;
        }
        if (uVar9 < 10000) goto LAB_0013dd6d;
        bVar13 = 99999 < uVar9;
        uVar9 = uVar9 / 10000;
        cVar5 = cVar10 + '\x04';
      } while (bVar13);
      cVar10 = cVar10 + '\x01';
    }
LAB_0013dd6d:
    local_58 = (undefined1  [8])psVar1;
    std::__cxx11::string::_M_construct((ulong)local_58,cVar10);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)local_58,(uint)length._M_dataplus._M_p,__val);
    length.field_2._8_8_ = anon_var_dwarf_44122;
    local_80 = (size_type *)local_58;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const*&,char_const*&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)this_00,(char **)((long)&length.field_2 + 8),(char **)&local_80);
    if (local_58 != (undefined1  [8])psVar1) {
      operator_delete((void *)local_58);
    }
  }
  this_01 = local_60;
  p_Var8 = (res->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var12 = &(res->headers)._M_t._M_impl.super__Rb_tree_header;
  local_68 = res;
  if ((_Rb_tree_header *)p_Var8 != p_Var12) {
    do {
      local_58 = *(undefined1 (*) [8])(p_Var8 + 1);
      length.field_2._8_8_ = *(undefined8 *)(p_Var8 + 2);
      Stream::write_format<char_const*,char_const*>
                (this_01,"%s: %s\r\n",(char **)local_58,(char **)((long)&length.field_2 + 8));
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var12);
  }
  (*this_01->_vptr_Stream[4])(this_01,"\r\n");
  pRVar4 = local_68;
  pRVar3 = local_70;
  if ((local_68->body)._M_string_length != 0) {
    iVar6 = std::__cxx11::string::compare((char *)&local_70->method);
    if (iVar6 != 0) {
      (*this_01->_vptr_Stream[3])
                (this_01,(pRVar4->body)._M_dataplus._M_p,(pRVar4->body)._M_string_length);
    }
  }
  if ((local_78->logger_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(local_78->logger_)._M_invoker)((_Any_data *)&local_78->logger_,pRVar3,pRVar4);
  }
  return;
}

Assistant:

inline void Server::write_response(Stream& strm, bool last_connection, const Request& req, Response& res)
{
    assert(res.status != -1);

    if (400 <= res.status && error_handler_) {
        error_handler_(req, res);
    }

    // Response line
    strm.write_format("HTTP/1.1 %d %s\r\n",
        res.status,
        detail::status_message(res.status));

    // Headers
    if (last_connection ||
        req.version == "HTTP/1.0" ||
        req.get_header_value("Connection") == "close") {
        res.set_header("Connection", "close");
    }

    if (!res.body.empty()) {
#ifdef CPPHTTPLIB_ZLIB_SUPPORT
        // TODO: 'Accpet-Encoding' has gzip, not gzip;q=0
        const auto& encodings = req.get_header_value("Accept-Encoding");
        if (encodings.find("gzip") != std::string::npos &&
            detail::can_compress(res.get_header_value("Content-Type"))) {
            detail::compress(res.body);
            res.set_header("Content-Encoding", "gzip");
        }
#endif

        if (!res.has_header("Content-Type")) {
            res.set_header("Content-Type", "text/plain");
        }

        auto length = std::to_string(res.body.size());
        res.set_header("Content-Length", length.c_str());
    }

    detail::write_headers(strm, res);

    // Body
    if (!res.body.empty() && req.method != "HEAD") {
        strm.write(res.body.c_str(), res.body.size());
    }

    // Log
    if (logger_) {
        logger_(req, res);
    }
}